

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
          (internal *this,null_terminating_iterator<char> it,
          width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
          *handler)

{
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  *this_00;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg_00;
  internal iVar1;
  uint arg_id;
  type tVar2;
  long *plVar3;
  int iVar4;
  internal *piVar5;
  internal *piVar6;
  undefined4 *puVar7;
  internal *piVar8;
  internal *piVar9;
  null_terminating_iterator<char> nVar10;
  basic_string_view<char> name;
  undefined1 local_51;
  undefined1 *local_50;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  plVar3 = (long *)it.end_;
  piVar5 = (internal *)it.ptr_;
  if (this == piVar5) {
    iVar1 = (internal)0x0;
  }
  else {
    iVar1 = *this;
  }
  if ((iVar1 == (internal)0x7d) || (iVar1 == (internal)0x3a)) {
    puVar7 = *(undefined4 **)*plVar3;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
    next_arg((format_arg *)&local_48.string,
             (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
              *)((undefined8 *)*plVar3)[1]);
    piVar8 = this;
  }
  else {
    if (9 < (byte)((char)iVar1 - 0x30U)) {
      if ((iVar1 != (internal)0x5f) && (0x19 < (byte)(((byte)iVar1 & 0xdf) + 0xbf))) {
LAB_0011fccb:
        error_handler::on_error((error_handler *)this,"invalid format string");
      }
      name.size_ = 0;
      piVar9 = this + 1;
      do {
        piVar8 = piVar9;
        if (piVar8 == piVar5) {
          iVar1 = (internal)0x0;
        }
        else {
          iVar1 = *piVar8;
        }
        piVar9 = piVar8 + 1;
        name.size_ = name.size_ + 1;
      } while ((((byte)((char)iVar1 - 0x30U) < 10) || (iVar1 == (internal)0x5f)) ||
              ((byte)(((byte)iVar1 & 0xdf) + 0xbf) < 0x1a));
      puVar7 = *(undefined4 **)*plVar3;
      name.data_ = (char *)this;
      basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
      ::get_arg((format_arg *)&local_48.string,
                (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
                 *)((undefined8 *)*plVar3)[1],name);
      local_50 = &local_51;
      this = (internal *)&local_50;
      arg_00.value_.field_0.string.size = local_48.string.size;
      arg_00.value_.field_0.long_long_value = local_48.long_long_value;
      arg_00._16_8_ = local_38;
      arg_00._24_8_ = uStack_30;
      tVar2 = visit<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                        ((width_checker<fmt::v5::internal::error_handler> *)this,arg_00);
      if ((tVar2 & 0xffffffff80000000) != 0) goto LAB_0011fcbf;
      *puVar7 = (int)tVar2;
      goto LAB_0011fb6e;
    }
    arg_id = 0;
    piVar8 = this + 1;
    piVar9 = this;
    do {
      piVar6 = piVar8;
      if (piVar6 + -1 == piVar5) {
        iVar4 = -0x30;
      }
      else {
        iVar4 = (char)piVar6[-1] + -0x30;
      }
      arg_id = arg_id * 10 + iVar4;
      piVar8 = piVar5;
      if ((piVar6 == piVar5) ||
         (piVar9 = piVar9 + 1, piVar8 = piVar9, 9 < (byte)((char)*piVar6 - 0x30U)))
      goto LAB_0011fc7a;
      piVar8 = piVar6 + 1;
    } while (arg_id < 0xccccccd);
    arg_id = 0x80000000;
    piVar8 = piVar6;
LAB_0011fc7a:
    if ((int)arg_id < 0) goto LAB_0011fcbf;
    if ((piVar6 == piVar5) ||
       ((*piVar8 != (internal)0x7d && ((piVar6 == piVar5 || (*piVar8 != (internal)0x3a))))))
    goto LAB_0011fccb;
    this_00 = (context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               *)((undefined8 *)*plVar3)[1];
    if (0 < (this_00->parse_context_).next_arg_id_) {
      error_handler::on_error
                ((error_handler *)this,"cannot switch from automatic to manual argument indexing");
    }
    puVar7 = *(undefined4 **)*plVar3;
    (this_00->parse_context_).next_arg_id_ = -1;
    context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
    ::do_get_arg((format_arg *)&local_48.string,this_00,arg_id);
  }
  local_50 = &local_51;
  this = (internal *)&local_50;
  arg.value_.field_0.string.size = local_48.string.size;
  arg.value_.field_0.long_long_value = local_48.long_long_value;
  arg._16_8_ = local_38;
  arg._24_8_ = uStack_30;
  tVar2 = visit<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ((width_checker<fmt::v5::internal::error_handler> *)this,arg);
  if ((tVar2 & 0xffffffff80000000) != 0) {
LAB_0011fcbf:
    error_handler::on_error((error_handler *)this,"number is too big");
  }
  *puVar7 = (int)tVar2;
LAB_0011fb6e:
  nVar10.end_ = (char *)piVar5;
  nVar10.ptr_ = (char *)piVar8;
  return nVar10;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(pointer_from(start), to_unsigned(it - start)));
  return it;
}